

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_expression(Parser *this)

{
  string *token;
  bool bVar1;
  ostream *poVar2;
  string symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<expression>");
  std::endl<char,std::char_traits<char>>(poVar2);
  token = &this->cur_token;
  bVar1 = Tokenizer::op_exists(this->tokenizer,token);
  if (!bVar1) {
    expression_writer(this,token);
  }
  parse_term(this);
  while( true ) {
    bVar1 = Tokenizer::op_exists(this->tokenizer,token);
    poVar2 = (ostream *)this->out_file;
    if (!bVar1) break;
    std::operator+(&local_50,"\t\t\t\t\t<symbol>",token);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,"</symbol>");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,(string *)token);
    query_tokenizer(this);
    expression_writer(this,token);
    parse_term(this);
    expression_writer(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar2 = std::operator<<(poVar2,"\t\t\t\t</expression>");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Parser::parse_expression() {
    out_file << "\t\t\t\t<expression>" << std::endl;
    if (!tokenizer.op_exists(cur_token)) {
        expression_writer(cur_token);
    }
    parse_term();

    while (tokenizer.op_exists(cur_token)) {
        out_file << "\t\t\t\t\t<symbol>" + cur_token << "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        expression_writer(cur_token);
        parse_term();
        expression_writer(symbol);
    }

    out_file << "\t\t\t\t</expression>" << std::endl;
}